

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  int index;
  undefined1 *from;
  int iVar5;
  ModelDescription *description;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  GLMRegressor lr;
  allocator_type local_d9;
  string local_d8;
  Result *local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  TypeCase local_84 [3];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  int local_50;
  Model *local_38;
  
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  local_78[0] = false;
  local_78[1] = false;
  local_78[2] = false;
  local_78[3] = false;
  validateRegressorInterface
            ((Result *)local_b0,description,format->specificationversion_,
             (ValidationPolicy *)local_78);
  bVar2 = Result::good((Result *)local_b0);
  if (bVar2) {
    local_b8 = __return_storage_ptr__;
    local_38 = format;
    if (0 < (description->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_84[0] = kDoubleType;
        local_84[1] = kMultiArrayType;
        local_84[2] = 1;
        __l._M_len = 3;
        __l._M_array = local_84;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_d8,__l,&local_d9);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->input_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_78,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)&local_d8,pTVar3);
        local_b0._4_4_ = local_78._4_4_;
        local_b0._0_4_ = local_78._0_4_;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_70);
        if (local_70._M_p != local_68 + 8) {
          operator_delete(local_70._M_p,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
        bVar2 = Result::good((Result *)local_b0);
        __return_storage_ptr__ = local_b8;
        if (!bVar2) goto LAB_002f02cb;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (0 < (description->output_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_84[0] = 2;
        __l_00._M_len = 1;
        __l_00._M_array = local_84;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_d8,__l_00,&local_d9);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->output_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_78,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)&local_d8,pTVar3);
        local_b0._4_4_ = local_78._4_4_;
        local_b0._0_4_ = local_78._0_4_;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_70);
        if (local_70._M_p != local_68 + 8) {
          operator_delete(local_70._M_p,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
        bVar2 = Result::good((Result *)local_b0);
        __return_storage_ptr__ = local_b8;
        if (!bVar2) goto LAB_002f02cb;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->output_).super_RepeatedPtrFieldBase.current_size_);
    }
    __return_storage_ptr__ = local_b8;
    if (local_38->_oneof_case_[0] == 300) {
      from = (undefined1 *)(local_38->Type_).glmregressor_;
    }
    else {
      from = Specification::_GLMRegressor_default_instance_;
    }
    Specification::GLMRegressor::GLMRegressor((GLMRegressor *)local_78,(GLMRegressor *)from);
    if (local_68._8_4_ == local_50) {
      if ((0 < (int)local_68._8_4_) && (local_68._8_4_ != 1)) {
        iVar5 = *(int *)(*(long *)(local_68._16_8_ + 8) + 0x10);
        index = 1;
        do {
          pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                             ((RepeatedPtrFieldBase *)local_68,index);
          if ((pTVar4->value_).current_size_ != iVar5) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"All weight coefficients must be the same size.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
            goto LAB_002f03bc;
          }
          index = index + 1;
        } while (index < (int)local_68._8_4_);
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Weights and offsets must be the same size.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
LAB_002f03bc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    Specification::GLMRegressor::~GLMRegressor((GLMRegressor *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
  }
  else {
LAB_002f02cb:
    __return_storage_ptr__->m_type = local_b0._0_4_;
    __return_storage_ptr__->m_reason = local_b0._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p == &local_98) {
      paVar1->_M_allocated_capacity = local_98._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_98._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_98._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_a0;
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }